

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenModuleSetTypeName(BinaryenModuleRef module,BinaryenHeapType heapType,char *name)

{
  IString *this;
  mapped_type *pmVar1;
  undefined1 in_CL;
  string_view sVar2;
  key_type local_30;
  
  this = (IString *)strlen(name);
  sVar2._M_str = (char *)0x0;
  sVar2._M_len = (size_t)name;
  sVar2 = wasm::IString::interned(this,sVar2,(bool)in_CL);
  local_30.id = heapType;
  pmVar1 = std::__detail::
           _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&module->typeNames,&local_30);
  (pmVar1->name).super_IString.str = sVar2;
  return;
}

Assistant:

void BinaryenModuleSetTypeName(BinaryenModuleRef module,
                               BinaryenHeapType heapType,
                               const char* name) {
  ((Module*)module)->typeNames[HeapType(heapType)].name = name;
}